

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-fail.c
# Opt level: O2

int run_test_tcp_write_fail(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_120;
  sockaddr_in addr;
  uv_tcp_t client;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&client);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_connect(&connect_req,&client,(sockaddr *)&addr,connect_cb);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        uv_run(puVar2,UV_RUN_DEFAULT);
        if (connect_cb_called == 1) {
          if (write_cb_called == 1) {
            if (close_cb_called == 1) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uStack_120 = 0x71;
            }
            else {
              pcVar3 = "close_cb_called == 1";
              uStack_120 = 0x6f;
            }
          }
          else {
            pcVar3 = "write_cb_called == 1";
            uStack_120 = 0x6e;
          }
        }
        else {
          pcVar3 = "connect_cb_called == 1";
          uStack_120 = 0x6d;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_120 = 0x69;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_120 = 99;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_120 = 0x60;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-fail.c"
          ,uStack_120,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_write_fail) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}